

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void Blowfish_encipher(blf_ctx *c,uint32_t *xl,uint32_t *xr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t *p;
  uint32_t *s;
  uint32_t Xr;
  uint32_t Xl;
  uint32_t *xr_local;
  uint32_t *xl_local;
  blf_ctx *c_local;
  
  uVar6 = c->P[0] ^ *xl;
  uVar7 = (c->S[0][uVar6 >> 0x18] + c->S[0][(uVar6 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar6 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar6 & 0xff) + 0x300] ^ c->P[1] ^ *xr;
  uVar6 = (c->S[0][uVar7 >> 0x18] + c->S[0][(uVar7 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar7 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar7 & 0xff) + 0x300] ^ c->P[2] ^ uVar6;
  uVar7 = (c->S[0][uVar6 >> 0x18] + c->S[0][(uVar6 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar6 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar6 & 0xff) + 0x300] ^ c->P[3] ^ uVar7;
  uVar6 = (c->S[0][uVar7 >> 0x18] + c->S[0][(uVar7 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar7 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar7 & 0xff) + 0x300] ^ c->P[4] ^ uVar6;
  uVar7 = (c->S[0][uVar6 >> 0x18] + c->S[0][(uVar6 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar6 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar6 & 0xff) + 0x300] ^ c->P[5] ^ uVar7;
  uVar6 = (c->S[0][uVar7 >> 0x18] + c->S[0][(uVar7 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar7 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar7 & 0xff) + 0x300] ^ c->P[6] ^ uVar6;
  uVar7 = (c->S[0][uVar6 >> 0x18] + c->S[0][(uVar6 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar6 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar6 & 0xff) + 0x300] ^ c->P[7] ^ uVar7;
  uVar6 = (c->S[0][uVar7 >> 0x18] + c->S[0][(uVar7 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar7 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar7 & 0xff) + 0x300] ^ c->P[8] ^ uVar6;
  uVar7 = (c->S[0][uVar6 >> 0x18] + c->S[0][(uVar6 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar6 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar6 & 0xff) + 0x300] ^ c->P[9] ^ uVar7;
  uVar6 = (c->S[0][uVar7 >> 0x18] + c->S[0][(uVar7 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar7 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar7 & 0xff) + 0x300] ^ c->P[10] ^ uVar6
  ;
  uVar7 = (c->S[0][uVar6 >> 0x18] + c->S[0][(uVar6 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar6 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar6 & 0xff) + 0x300] ^ c->P[0xb] ^
          uVar7;
  uVar6 = (c->S[0][uVar7 >> 0x18] + c->S[0][(uVar7 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar7 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar7 & 0xff) + 0x300] ^ c->P[0xc] ^
          uVar6;
  uVar7 = (c->S[0][uVar6 >> 0x18] + c->S[0][(uVar6 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar6 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar6 & 0xff) + 0x300] ^ c->P[0xd] ^
          uVar7;
  uVar6 = (c->S[0][uVar7 >> 0x18] + c->S[0][(uVar7 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar7 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar7 & 0xff) + 0x300] ^ c->P[0xe] ^
          uVar6;
  uVar7 = (c->S[0][uVar6 >> 0x18] + c->S[0][(uVar6 >> 0x10 & 0xff) + 0x100] ^
          c->S[0][(uVar6 >> 8 & 0xff) + 0x200]) + c->S[0][(uVar6 & 0xff) + 0x300] ^ c->P[0xf] ^
          uVar7;
  uVar1 = c->S[0][uVar7 >> 0x18];
  uVar2 = c->S[0][(uVar7 >> 0x10 & 0xff) + 0x100];
  uVar3 = c->S[0][(uVar7 >> 8 & 0xff) + 0x200];
  uVar4 = c->S[0][(uVar7 & 0xff) + 0x300];
  uVar5 = c->P[0x10];
  *xl = uVar7 ^ c->P[0x11];
  *xr = (uVar1 + uVar2 ^ uVar3) + uVar4 ^ uVar5 ^ uVar6;
  return;
}

Assistant:

static void
Blowfish_encipher(blf_ctx *c, uint32_t *xl, uint32_t *xr)
{
    uint32_t Xl;
    uint32_t Xr;
    uint32_t *s = c->S[0];
    uint32_t *p = c->P;

    Xl = *xl;
    Xr = *xr;

    Xl ^= p[0];
    BLFRND(s, p, Xr, Xl, 1); BLFRND(s, p, Xl, Xr, 2);
    BLFRND(s, p, Xr, Xl, 3); BLFRND(s, p, Xl, Xr, 4);
    BLFRND(s, p, Xr, Xl, 5); BLFRND(s, p, Xl, Xr, 6);
    BLFRND(s, p, Xr, Xl, 7); BLFRND(s, p, Xl, Xr, 8);
    BLFRND(s, p, Xr, Xl, 9); BLFRND(s, p, Xl, Xr, 10);
    BLFRND(s, p, Xr, Xl, 11); BLFRND(s, p, Xl, Xr, 12);
    BLFRND(s, p, Xr, Xl, 13); BLFRND(s, p, Xl, Xr, 14);
    BLFRND(s, p, Xr, Xl, 15); BLFRND(s, p, Xl, Xr, 16);

    *xl = Xr ^ p[17];
    *xr = Xl;
}